

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O1

Gia_Man_t * Gia_ManDupWithMuxPos(Gia_Man_t *p)

{
  byte *pbVar1;
  uint uVar2;
  uint uVar3;
  uint Entry;
  uint Entry_00;
  int iVar4;
  Gia_Obj_t *pGVar5;
  Gia_Obj_t *pGVar6;
  int iVar7;
  Vec_Int_t *p_00;
  int *piVar8;
  Vec_Int_t *p_01;
  void *__s;
  void *__s_00;
  Gia_Man_t *p_02;
  Gia_Obj_t *pGVar9;
  Gia_Obj_t *pGVar10;
  uint *puVar11;
  int iVar12;
  Vec_Int_t *pVVar13;
  ulong uVar14;
  size_t sVar15;
  uint uVar16;
  size_t sVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  Gia_Obj_t *pGVar21;
  Gia_Obj_t *pGVar22;
  Gia_Obj_t *pData1;
  Gia_Obj_t *pData0;
  Gia_Obj_t *local_48;
  Gia_Obj_t *local_40;
  long local_38;
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 1000;
  p_00->nSize = 0;
  piVar8 = (int *)malloc(4000);
  p_00->pArray = piVar8;
  p_01 = (Vec_Int_t *)malloc(0x10);
  p_01->nCap = 1000;
  p_01->nSize = 0;
  piVar8 = (int *)malloc(4000);
  p_01->pArray = piVar8;
  iVar12 = ((p->nObjs >> 5) + 1) - (uint)((p->nObjs & 0x1fU) == 0);
  if (iVar12 == 0) {
    __s = (void *)0x0;
  }
  else {
    __s = malloc((long)iVar12 * 4);
  }
  sVar17 = (long)iVar12 << 2;
  __s_00 = (void *)0x0;
  memset(__s,0,sVar17);
  if (iVar12 != 0) {
    __s_00 = malloc(sVar17);
  }
  memset(__s_00,0,sVar17);
  p_02 = Gia_ManDup(p);
  if (p_02->nRegs != 0) {
    __assert_fail("Gia_ManRegNum(pNew) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaUtil.c"
                  ,0x8d2,"Gia_Man_t *Gia_ManDupWithMuxPos(Gia_Man_t *)");
  }
  iVar12 = iVar12 * 0x20;
  if (0 < p_02->nObjs) {
    lVar19 = 0;
    lVar18 = 0;
    do {
      pGVar10 = p_02->pObjs;
      if (pGVar10 == (Gia_Obj_t *)0x0) break;
      pGVar6 = (Gia_Obj_t *)(&pGVar10->field_0x0 + lVar19);
      if ((~*(uint *)pGVar6 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar6) {
        iVar7 = Gia_ObjIsMuxType(pGVar6);
        if (iVar7 != 0) {
          local_38 = lVar18;
          pGVar9 = Gia_ObjRecognizeMux(pGVar6,&local_48,&local_40);
          pGVar22 = (Gia_Obj_t *)((ulong)local_40 & 0xfffffffffffffffe);
          pGVar21 = (Gia_Obj_t *)((ulong)local_48 & 0xfffffffffffffffe);
          pGVar5 = p_02->pObjs;
          local_48 = pGVar21;
          local_40 = pGVar22;
          if ((pGVar6 < pGVar5) || (pGVar5 + p_02->nObjs <= pGVar6)) goto LAB_00246803;
          pGVar9 = (Gia_Obj_t *)((ulong)pGVar9 & 0xfffffffffffffffe);
          if ((pGVar9 < pGVar5) || (pGVar5 + p_02->nObjs <= pGVar9)) goto LAB_00246803;
          Vec_IntPush(p_01,(int)((ulong)((long)pGVar10 + (lVar19 - (long)pGVar5)) >> 2) *
                           -0x55555555);
          Vec_IntPush(p_01,(int)((ulong)((long)pGVar9 - (long)pGVar5) >> 2) * -0x55555555);
          pGVar5 = p_02->pObjs;
          if ((((pGVar22 < pGVar5) || (pGVar5 + p_02->nObjs <= pGVar22)) || (pGVar21 < pGVar5)) ||
             (pGVar5 + p_02->nObjs <= pGVar21)) goto LAB_00246803;
          Vec_IntPush(p_01,(int)((ulong)((long)pGVar22 - (long)pGVar5) >> 2) * -0x55555555);
          Vec_IntPush(p_01,(int)((ulong)((long)pGVar21 - (long)pGVar5) >> 2) * -0x55555555);
          pGVar5 = p_02->pObjs;
          if ((pGVar6 < pGVar5) || (pGVar5 + p_02->nObjs <= pGVar6)) goto LAB_00246803;
          lVar18 = ((long)pGVar10 + (lVar19 - (long)pGVar5) >> 2) * -0x5555555555555555;
          uVar16 = (uint)lVar18;
          if (((int)uVar16 < 0) || (iVar12 <= (int)uVar16)) {
LAB_00246930:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                          ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
          }
          puVar11 = (uint *)((long)__s + (ulong)(uVar16 >> 3 & 0xffffffc));
          *puVar11 = *puVar11 | 1 << ((byte)lVar18 & 0x1f);
          if ((pGVar22 < pGVar5) || (pGVar5 + p_02->nObjs <= pGVar22)) goto LAB_00246803;
          lVar18 = ((long)pGVar22 - (long)pGVar5 >> 2) * -0x5555555555555555;
          uVar16 = (uint)lVar18;
          if (((int)uVar16 < 0) || (iVar12 <= (int)uVar16)) goto LAB_00246930;
          puVar11 = (uint *)((long)__s_00 + (ulong)(uVar16 >> 3 & 0xffffffc));
          *puVar11 = *puVar11 | 1 << ((byte)lVar18 & 0x1f);
          if ((pGVar21 < pGVar5) || (pGVar5 + p_02->nObjs <= pGVar21)) goto LAB_00246803;
          lVar18 = ((long)pGVar21 - (long)pGVar5 >> 2) * -0x5555555555555555;
          uVar16 = (uint)lVar18;
          if (((int)uVar16 < 0) || (iVar12 <= (int)uVar16)) goto LAB_00246930;
          puVar11 = (uint *)((long)__s_00 + (ulong)(uVar16 >> 3 & 0xffffffc));
          *puVar11 = *puVar11 | 1 << ((byte)lVar18 & 0x1f);
          lVar18 = local_38;
        }
      }
      lVar18 = lVar18 + 1;
      lVar19 = lVar19 + 0xc;
    } while (lVar18 < p_02->nObjs);
  }
  pVVar13 = p_02->vCos;
  if (0 < pVVar13->nSize) {
    lVar18 = 0;
    do {
      iVar7 = pVVar13->pArray[lVar18];
      if (((long)iVar7 < 0) || (p_02->nObjs <= iVar7)) goto LAB_00246822;
      if (p_02->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar10 = p_02->pObjs + iVar7;
      *(ulong *)(pGVar10 + -(ulong)((uint)*(undefined8 *)pGVar10 & 0x1fffffff)) =
           *(ulong *)(pGVar10 + -(ulong)((uint)*(undefined8 *)pGVar10 & 0x1fffffff)) | 0x40000000;
      lVar18 = lVar18 + 1;
      pVVar13 = p_02->vCos;
    } while (lVar18 < pVVar13->nSize);
  }
  uVar16 = p_01->nSize;
  uVar14 = (ulong)(int)uVar16;
  if (3 < (long)uVar14) {
    uVar20 = 0;
    do {
      if ((((uVar14 <= uVar20) || (uVar14 <= uVar20 + 1)) || (uVar14 <= uVar20 + 2)) ||
         (uVar14 <= uVar20 + 3)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar8 = p_01->pArray;
      uVar2 = piVar8[uVar20];
      if (((int)uVar2 < 0) || (iVar12 <= (int)uVar2)) {
LAB_00246860:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                      ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
      }
      uVar3 = piVar8[uVar20 + 1];
      Entry = piVar8[uVar20 + 2];
      Entry_00 = piVar8[uVar20 + 3];
      if (((*(uint *)((long)__s + (ulong)(uVar2 >> 5) * 4) >> (uVar2 & 0x1f) & 1) == 0) ||
         ((*(uint *)((long)__s_00 + (ulong)(uVar2 >> 5) * 4) >> (uVar2 & 0x1f) & 1) == 0)) {
        if (((int)Entry < 0) || (iVar12 <= (int)Entry)) goto LAB_00246860;
        if (((*(uint *)((long)__s + (ulong)(Entry >> 5) * 4) >> (Entry & 0x1f) & 1) != 0) &&
           ((*(uint *)((long)__s_00 + (ulong)(Entry >> 5) * 4) >> (Entry & 0x1f) & 1) != 0))
        goto LAB_0024636f;
        if (((int)Entry_00 < 0) || (iVar12 <= (int)Entry_00)) goto LAB_00246860;
        if (((*(uint *)((long)__s + (ulong)(Entry_00 >> 5) * 4) >> (Entry_00 & 0x1f) & 1) != 0) &&
           ((*(uint *)((long)__s_00 + (ulong)(Entry_00 >> 5) * 4) >> (Entry_00 & 0x1f) & 1) != 0))
        goto LAB_0024636f;
      }
      else {
LAB_0024636f:
        iVar7 = p->nObjs;
        if (((iVar7 <= (int)uVar2) ||
            ((((int)uVar3 < 0 || (iVar7 <= (int)uVar3)) || ((int)Entry < 0)))) ||
           (((iVar7 <= (int)Entry || ((int)Entry_00 < 0)) || (iVar7 <= (int)Entry_00))))
        goto LAB_00246822;
        pGVar10 = p->pObjs;
        if ((*(ulong *)(pGVar10 + uVar2) & 0xc0000000) == 0 &&
            (~(uint)*(ulong *)(pGVar10 + uVar2) & 0x1fffffff) != 0) {
          Vec_IntPush(p_00,uVar2);
        }
        if ((*(ulong *)(pGVar10 + uVar3) & 0xc0000000) == 0 &&
            (~(uint)*(ulong *)(pGVar10 + uVar3) & 0x1fffffff) != 0) {
          Vec_IntPush(p_00,uVar3);
        }
        if ((*(ulong *)(pGVar10 + Entry) & 0xc0000000) == 0 &&
            (~(uint)*(ulong *)(pGVar10 + Entry) & 0x1fffffff) != 0) {
          Vec_IntPush(p_00,Entry);
        }
        if ((*(ulong *)(pGVar10 + Entry_00) & 0xc0000000) == 0 &&
            (~(uint)*(ulong *)(pGVar10 + Entry_00) & 0x1fffffff) != 0) {
          Vec_IntPush(p_00,Entry_00);
        }
      }
      uVar20 = uVar20 + 4;
    } while ((uVar16 & 0xfffffffc) != uVar20);
  }
  if (0 < p_02->nObjs) {
    lVar18 = 0;
    lVar19 = 0;
    do {
      if (p_02->pObjs == (Gia_Obj_t *)0x0) break;
      pbVar1 = &p_02->pObjs->field_0x3 + lVar18;
      *pbVar1 = *pbVar1 & 0xbf;
      lVar19 = lVar19 + 1;
      lVar18 = lVar18 + 0xc;
    } while (lVar19 < p_02->nObjs);
  }
  sVar17 = (size_t)p_00->nSize;
  if (1 < (long)sVar17) {
    piVar8 = p_00->pArray;
    qsort(piVar8,sVar17,4,Vec_IntSortCompare1);
    iVar12 = 1;
    sVar15 = 1;
    do {
      if (piVar8[sVar15] != piVar8[sVar15 - 1]) {
        lVar18 = (long)iVar12;
        iVar12 = iVar12 + 1;
        piVar8[lVar18] = piVar8[sVar15];
      }
      sVar15 = sVar15 + 1;
    } while (sVar17 != sVar15);
    p_00->nSize = iVar12;
  }
  iVar12 = p_00->nSize;
  if (0 < (long)iVar12) {
    piVar8 = p_00->pArray;
    lVar18 = 0;
    do {
      iVar7 = piVar8[lVar18];
      if ((long)iVar7 < 0) {
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12e,"int Abc_Var2Lit(int, int)");
      }
      uVar16 = p_02->nObjs;
      if ((int)uVar16 <= iVar7) {
        __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x314,"int Gia_ManAppendCo(Gia_Man_t *, int)");
      }
      if ((~*(uint *)(p_02->pObjs + iVar7) & 0x1fffffff) != 0 &&
          (int)*(uint *)(p_02->pObjs + iVar7) < 0) {
        __assert_fail("!Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0)))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x315,"int Gia_ManAppendCo(Gia_Man_t *, int)");
      }
      uVar2 = p_02->nObjsAlloc;
      if (uVar16 == uVar2) {
        uVar3 = uVar2 * 2;
        if (0x1fffffff < (int)(uVar2 * 2)) {
          uVar3 = 0x20000000;
        }
        if (uVar16 == 0x20000000) {
          puts("Hard limit on the number of nodes (2^29) is reached. Quitting...");
          exit(1);
        }
        if ((int)uVar3 <= (int)uVar16) {
          __assert_fail("p->nObjs < nObjNew",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x288,"Gia_Obj_t *Gia_ManAppendObj(Gia_Man_t *)");
        }
        if (p_02->fVerbose != 0) {
          printf("Extending GIA object storage: %d -> %d.\n",(ulong)uVar2,(ulong)uVar3);
        }
        if (p_02->nObjsAlloc < 1) {
          __assert_fail("p->nObjsAlloc > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x28b,"Gia_Obj_t *Gia_ManAppendObj(Gia_Man_t *)");
        }
        lVar19 = (long)(int)uVar3;
        if (p_02->pObjs == (Gia_Obj_t *)0x0) {
          pGVar10 = (Gia_Obj_t *)malloc(lVar19 * 0xc);
        }
        else {
          pGVar10 = (Gia_Obj_t *)realloc(p_02->pObjs,lVar19 * 0xc);
        }
        p_02->pObjs = pGVar10;
        memset(pGVar10 + p_02->nObjsAlloc,0,(lVar19 - p_02->nObjsAlloc) * 0xc);
        if (p_02->pMuxes != (uint *)0x0) {
          puVar11 = (uint *)realloc(p_02->pMuxes,lVar19 * 4);
          p_02->pMuxes = puVar11;
          memset(puVar11 + p_02->nObjsAlloc,0,(lVar19 - p_02->nObjsAlloc) * 4);
        }
        p_02->nObjsAlloc = uVar3;
      }
      if ((p_02->vHTable).nSize != 0) {
        Vec_IntPush(&p_02->vHash,0);
      }
      iVar4 = p_02->nObjs;
      p_02->nObjs = iVar4 + 1;
      if ((long)iVar4 < 0) {
LAB_00246822:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar10 = p_02->pObjs + iVar4;
      uVar14 = *(ulong *)pGVar10;
      *(ulong *)pGVar10 = uVar14 | 0x80000000;
      pGVar6 = p_02->pObjs;
      if ((pGVar10 < pGVar6) || (pGVar6 + p_02->nObjs <= pGVar10)) {
LAB_00246803:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      uVar20 = (ulong)(((uint)((int)pGVar10 - (int)pGVar6) >> 2) * -0x55555555 - iVar7 & 0x1fffffff)
      ;
      *(ulong *)pGVar10 = uVar14 & 0xffffffffc0000000 | 0x80000000 | uVar20;
      *(ulong *)pGVar10 =
           uVar14 & 0xe0000000c0000000 | 0x80000000 | uVar20 |
           (ulong)(p_02->vCos->nSize & 0x1fffffff) << 0x20;
      pGVar6 = p_02->pObjs;
      if ((pGVar10 < pGVar6) || (pGVar6 + p_02->nObjs <= pGVar10)) goto LAB_00246803;
      Vec_IntPush(p_02->vCos,(int)((ulong)((long)pGVar10 - (long)pGVar6) >> 2) * -0x55555555);
      if (p_02->pFanData != (int *)0x0) {
        Gia_ObjAddFanout(p_02,pGVar10 + -(ulong)((uint)*(undefined8 *)pGVar10 & 0x1fffffff),pGVar10)
        ;
      }
      if ((pGVar10 < p_02->pObjs) || (p_02->pObjs + p_02->nObjs <= pGVar10)) goto LAB_00246803;
      lVar18 = lVar18 + 1;
    } while (iVar12 != lVar18);
  }
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
    p_00->pArray = (int *)0x0;
  }
  free(p_00);
  if (p_01->pArray != (int *)0x0) {
    free(p_01->pArray);
    p_01->pArray = (int *)0x0;
  }
  free(p_01);
  if (__s != (void *)0x0) {
    free(__s);
  }
  if (__s_00 != (void *)0x0) {
    free(__s_00);
  }
  return p_02;
}

Assistant:

Gia_Man_t * Gia_ManDupWithMuxPos( Gia_Man_t * p )
{
    Vec_Int_t * vPoints = Vec_IntAlloc( 1000 );
    Vec_Int_t * vQuads  = Vec_IntAlloc( 1000 );
    Vec_Bit_t * vHeads  = Vec_BitStart( Gia_ManObjNum(p) );
    Vec_Bit_t * vDatas  = Vec_BitStart( Gia_ManObjNum(p) );
    Gia_Obj_t * pObj, * pCtrl, * pData0, * pData1;
    Gia_Man_t * pNew = Gia_ManDup( p ); int i, iObj;
    assert( Gia_ManRegNum(pNew) == 0 );
    Gia_ManForEachAnd( pNew, pObj, i )
    {
        if ( !Gia_ObjIsMuxType(pObj) )
            continue;
        pCtrl  = Gia_ObjRecognizeMux( pObj, &pData1, &pData0 );
        pCtrl  = Gia_Regular(pCtrl);
        pData0 = Gia_Regular(pData0);
        pData1 = Gia_Regular(pData1);
        Vec_IntPushTwo( vQuads, Gia_ObjId(pNew, pObj),   Gia_ObjId(pNew, pCtrl)  );
        Vec_IntPushTwo( vQuads, Gia_ObjId(pNew, pData0), Gia_ObjId(pNew, pData1) );
        Vec_BitWriteEntry( vHeads, Gia_ObjId(pNew, pObj),   1 );
        Vec_BitWriteEntry( vDatas, Gia_ObjId(pNew, pData0), 1 );
        Vec_BitWriteEntry( vDatas, Gia_ObjId(pNew, pData1), 1 );
    }
    Gia_ManForEachCo( pNew, pObj, i )
        Gia_ObjFanin0(pObj)->fMark0 = 1;
    for ( i = 0; i < Vec_IntSize(vQuads)/4; i++ )
    {
        int iObj   = Vec_IntEntry( vQuads, 4*i+0 );
        int iCtrl  = Vec_IntEntry( vQuads, 4*i+1 );
        int iData0 = Vec_IntEntry( vQuads, 4*i+2 );
        int iData1 = Vec_IntEntry( vQuads, 4*i+3 );
        if ( (Vec_BitEntry(vHeads, iObj)   && Vec_BitEntry(vDatas, iObj))   || 
             (Vec_BitEntry(vHeads, iData0) && Vec_BitEntry(vDatas, iData0)) || 
             (Vec_BitEntry(vHeads, iData1) && Vec_BitEntry(vDatas, iData1)) )
        {
            Gia_Obj_t * pObj   = Gia_ManObj( p, iObj );
            Gia_Obj_t * pCtrl  = Gia_ManObj( p, iCtrl );
            Gia_Obj_t * pData0 = Gia_ManObj( p, iData0 );
            Gia_Obj_t * pData1 = Gia_ManObj( p, iData1 );
            if ( Gia_ObjIsAnd(pObj)   && !pObj->fMark0   )  Vec_IntPush( vPoints, iObj   );
            if ( Gia_ObjIsAnd(pCtrl)  && !pCtrl->fMark0  )  Vec_IntPush( vPoints, iCtrl  );
            if ( Gia_ObjIsAnd(pData0) && !pData0->fMark0 )  Vec_IntPush( vPoints, iData0 );
            if ( Gia_ObjIsAnd(pData1) && !pData1->fMark0 )  Vec_IntPush( vPoints, iData1 );
        }
    }
    Gia_ManCleanMark0( pNew );
    Vec_IntUniqify( vPoints );
    Vec_IntForEachEntry( vPoints, iObj, i )
        Gia_ManAppendCo( pNew, Abc_Var2Lit(iObj, 0) );
    Vec_IntFree( vPoints );
    Vec_IntFree( vQuads );
    Vec_BitFree( vHeads );
    Vec_BitFree( vDatas );
    return pNew;
}